

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngstest.c
# Opt level: O1

void gpc_glin(Pixel *out,Pixel *in,Background *back)

{
  int iVar1;
  uint uVar2;
  double dVar3;
  
  iVar1 = in->g;
  if ((in->r == iVar1) && (iVar1 == in->b)) {
    dVar3 = sRGB_to_d[iVar1];
  }
  else {
    dVar3 = sRGB_to_d[in->b] * 0.0722 + sRGB_to_d[in->r] * 0.2126 + sRGB_to_d[iVar1] * 0.7152;
  }
  dVar3 = floor(dVar3 * 65535.0 + 0.5);
  uVar2 = (int)dVar3 & 0xffff;
  out->b = uVar2;
  out->g = uVar2;
  out->r = uVar2;
  out->a = 0xffff;
  return;
}

Assistant:

static void
gpc_glin(Pixel *out, const Pixel *in, const Background *back)
{
   (void)back;

   if (in->r == in->g && in->g == in->b)
      out->r = out->g = out->b = ilinear(in->g);

   else
      out->r = out->g = out->b = u16d(65535 *
         YfromRGB(sRGB_to_d[in->r], sRGB_to_d[in->g], sRGB_to_d[in->b]));

   out->a = 65535;
}